

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

void __thiscall DomUI::setElementTabStops(DomUI *this,DomTabStops *a)

{
  byte *pbVar1;
  DomTabStops *this_00;
  
  this_00 = this->m_tabStops;
  if (this_00 != (DomTabStops *)0x0) {
    DomTabStops::~DomTabStops(this_00);
  }
  operator_delete(this_00,0x20);
  pbVar1 = (byte *)((long)&this->m_children + 1);
  *pbVar1 = *pbVar1 | 2;
  this->m_tabStops = a;
  return;
}

Assistant:

void DomUI::setElementTabStops(DomTabStops *a)
{
    delete m_tabStops;
    m_children |= TabStops;
    m_tabStops = a;
}